

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall correctness_unary_plus_Test::TestBody(correctness_unary_plus_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  undefined1 local_50 [8];
  big_integer b;
  big_integer a;
  correctness_unary_plus_Test *this_local;
  
  big_integer::big_integer((big_integer *)&b.sign,0x7b);
  big_integer::operator+((big_integer *)local_50,(big_integer *)&b.sign);
  bVar1 = ::operator==((big_integer *)&b.sign,(big_integer *)local_50);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_70,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_70,(AssertionResult *)0x1b7404,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
               ,0xfe,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  big_integer::~big_integer((big_integer *)local_50);
  big_integer::~big_integer((big_integer *)&b.sign);
  return;
}

Assistant:

TEST(correctness, unary_plus) {
    big_integer a = 123;
    big_integer b = +a;

    EXPECT_TRUE(a == b);

    // this code should not compile:
    // &+a;
}